

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O2

uint4 Override::stringToType(string *nm)

{
  bool bVar1;
  uint4 uVar2;
  
  bVar1 = std::operator==(nm,"branch");
  if (bVar1) {
    uVar2 = 1;
  }
  else {
    bVar1 = std::operator==(nm,"call");
    if (bVar1) {
      uVar2 = 2;
    }
    else {
      bVar1 = std::operator==(nm,"callreturn");
      if (bVar1) {
        uVar2 = 3;
      }
      else {
        bVar1 = std::operator==(nm,"return");
        uVar2 = (uint)bVar1 << 2;
      }
    }
  }
  return uVar2;
}

Assistant:

uint4 Override::stringToType(const string &nm)

{
  if (nm == "branch")
    return Override::BRANCH;
  else if (nm == "call")
    return Override::CALL;
  else if (nm == "callreturn")
    return Override::CALL_RETURN;
  else if (nm == "return")
    return Override::RETURN;
  return Override::NONE;
}